

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

string * __thiscall pbrt::Sphere::ToString_abi_cxx11_(string *__return_storage_ptr__,Sphere *this)

{
  float *in_RAX;
  
  StringPrintf<pbrt::Transform_const&,pbrt::Transform_const&,bool_const&,bool_const&,float_const&,float_const&,float_const&,float_const&,float_const&,float_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ Sphere renderFromObject: %s objectFromRender: %s reverseOrientation: %s transformSwapsHandedness: %s radius: %f zMin: %f zMax: %f thetaMin: %f thetaMax: %f phiMax: %f ]"
             ,(char *)this->renderFromObject,this->objectFromRender,
             (Transform *)&this->reverseOrientation,&this->transformSwapsHandedness,(bool *)this,
             &this->zMin,&this->zMax,&this->thetaZMin,&this->thetaZMax,&this->phiMax,in_RAX);
  return __return_storage_ptr__;
}

Assistant:

std::string Sphere::ToString() const {
    return StringPrintf("[ Sphere renderFromObject: %s "
                        "objectFromRender: %s reverseOrientation: %s "
                        "transformSwapsHandedness: %s radius: %f zMin: %f "
                        "zMax: %f thetaMin: %f "
                        "thetaMax: %f phiMax: %f ]",
                        *renderFromObject, *objectFromRender, reverseOrientation,
                        transformSwapsHandedness, radius, zMin, zMax, thetaZMin,
                        thetaZMax, phiMax);
}